

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03-decompose.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  bool bVar1;
  failure *pfVar2;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  location local_1b0;
  int local_184;
  int local_180;
  expression_decomposer local_179;
  int *local_178;
  undefined1 local_170 [8];
  result failed_1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  location local_80;
  int local_58 [4];
  int local_48;
  expression_decomposer local_41;
  int *local_40;
  undefined1 local_38 [8];
  result failed;
  anon_class_1_0_00000001 *this_local;
  
  failed._32_8_ = this;
  do {
    local_48 = x();
    local_40 = (int *)lest::expression_decomposer::operator<<(&local_41,&local_48);
    local_58[0] = y();
    lest::expression_lhs<int_const&>::operator!=
              ((result *)local_38,(expression_lhs<int_const&> *)&local_40,local_58);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_38);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_a1);
      lest::location::location(&local_80,(text *)local_a0,0x27);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"x() != y()",&local_c9);
      std::__cxx11::string::string(local_f0,(string *)&failed);
      lest::failure::failure(pfVar2,&local_80,(string *)local_c8,(string *)local_f0);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_38);
    bVar1 = lest::is_false();
  } while (bVar1);
  do {
    local_180 = x();
    local_178 = (int *)lest::expression_decomposer::operator<<(&local_179,&local_180);
    local_184 = y();
    lest::expression_lhs<int_const&>::operator==
              ((result *)local_170,(expression_lhs<int_const&> *)&local_178,&local_184);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_170);
    if (bVar1) {
      pfVar2 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/03-decompose.cpp"
                 ,&local_1d1);
      lest::location::location(&local_1b0,(text *)local_1d0,0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"x() == y()",&local_1f9);
      std::__cxx11::string::string(local_220,(string *)&failed_1);
      lest::failure::failure(pfVar2,&local_1b0,(string *)local_1f8,(string *)local_220);
      __cxa_throw(pfVar2,&lest::failure::typeinfo,lest::failure::~failure);
    }
    lest::result::~result((result *)local_170);
    bVar1 = lest::is_false();
  } while (bVar1);
  return;
}

Assistant:

bool t() { return true; }